

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O1

int h264_dec_ref_base_pic_marking
              (bitstream *str,h264_nal_svc_header *svc,h264_dec_ref_base_pic_marking *ref)

{
  undefined8 *puVar1;
  int iVar2;
  h264_mmco_entry *phVar3;
  int iVar4;
  long lVar5;
  uint32_t *val;
  h264_mmco_entry mmco;
  undefined8 local_48;
  undefined8 uStack_40;
  uint32_t local_38;
  
  iVar2 = vs_u(str,&ref->store_ref_base_pic_flag,1);
  if (iVar2 != 0) {
    return 1;
  }
  if ((svc->use_ref_base_pic_flag != 0) || (ref->store_ref_base_pic_flag != 0)) {
    if (svc->idr_flag != 0) {
      return 0;
    }
    iVar2 = vs_u(str,&ref->adaptive_ref_base_pic_marking_mode_flag,1);
    if (iVar2 != 0) {
      return 1;
    }
    if (ref->adaptive_ref_base_pic_marking_mode_flag == 0) {
      return 0;
    }
    lVar5 = 0;
    do {
      if (str->dir == VS_ENCODE) {
        local_38 = *(uint32_t *)((long)&ref->mmcos->max_long_term_frame_idx_plus1 + lVar5);
        puVar1 = (undefined8 *)((long)&ref->mmcos->memory_management_control_operation + lVar5);
        local_48 = *puVar1;
        uStack_40 = puVar1[1];
      }
      iVar2 = vs_ue(str,(uint32_t *)&local_48);
      if (iVar2 != 0) {
        return 1;
      }
      if ((uint32_t)local_48 != 0) {
        val = (uint32_t *)&uStack_40;
        if (((uint32_t)local_48 != 2) &&
           (val = (uint32_t *)((long)&local_48 + 4), (uint32_t)local_48 != 1)) {
          fprintf(_stderr,"Unknown MMCO %d\n");
          return 1;
        }
        iVar2 = vs_ue(str,val);
        if (iVar2 != 0) {
          return 1;
        }
      }
      if (str->dir == VS_DECODE) {
        iVar2 = ref->mmcosmax;
        if (iVar2 <= ref->mmcosnum) {
          iVar4 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar4 = 0x10;
          }
          ref->mmcosmax = iVar4;
          phVar3 = (h264_mmco_entry *)realloc(ref->mmcos,(long)iVar4 * 0x14);
          ref->mmcos = phVar3;
        }
        phVar3 = ref->mmcos;
        iVar2 = ref->mmcosnum;
        ref->mmcosnum = iVar2 + 1;
        phVar3[iVar2].max_long_term_frame_idx_plus1 = local_38;
        phVar3 = phVar3 + iVar2;
        phVar3->memory_management_control_operation = (uint32_t)local_48;
        phVar3->difference_of_pic_nums_minus1 = local_48._4_4_;
        phVar3->long_term_pic_num = (undefined4)uStack_40;
        phVar3->long_term_frame_idx = uStack_40._4_4_;
      }
      lVar5 = lVar5 + 0x14;
    } while ((uint32_t)local_48 != 0);
  }
  return 0;
}

Assistant:

int h264_dec_ref_base_pic_marking(struct bitstream *str, struct h264_nal_svc_header *svc, struct h264_dec_ref_base_pic_marking *ref) {
	if (vs_u(str, &ref->store_ref_base_pic_flag, 1)) return 1;
	if ((svc->use_ref_base_pic_flag || ref->store_ref_base_pic_flag) && !svc->idr_flag) {
		if (vs_u(str, &ref->adaptive_ref_base_pic_marking_mode_flag, 1)) return 1;
		if (ref->adaptive_ref_base_pic_marking_mode_flag) {
			struct h264_mmco_entry mmco;
			int i = 0;
			do {
				if (str->dir == VS_ENCODE)
					mmco = ref->mmcos[i];
				if (vs_ue(str, &mmco.memory_management_control_operation)) return 1;
				switch (mmco.memory_management_control_operation) {
					case H264_MMCO_END:
						break;
					case H264_MMCO_FORGET_SHORT:
						if (vs_ue(str, &mmco.difference_of_pic_nums_minus1)) return 1;
						break;
					case H264_MMCO_FORGET_LONG:
						if (vs_ue(str, &mmco.long_term_pic_num)) return 1;
						break;
					default:
						fprintf (stderr, "Unknown MMCO %d\n", mmco.memory_management_control_operation);
						return 1;
				}
				if (str->dir == VS_DECODE) 
					ADDARRAY(ref->mmcos, mmco);
				i++;
			} while (mmco.memory_management_control_operation != H264_MMCO_END);
		}
	}
	return 0;
}